

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O2

int create_header(char *filename,uint32_t w,uint32_t h,uint8_t *data)

{
  undefined4 in_register_00000014;
  int iVar1;
  
  iVar1 = (int)filename * w * 3 + 0x36;
  *(undefined2 *)CONCAT44(in_register_00000014,h) = 0x4d42;
  *(char *)(CONCAT44(in_register_00000014,h) + 2) = (char)iVar1;
  *(char *)(CONCAT44(in_register_00000014,h) + 3) = (char)((uint)iVar1 >> 8);
  *(char *)(CONCAT44(in_register_00000014,h) + 4) = (char)((uint)iVar1 >> 0x10);
  *(char *)(CONCAT44(in_register_00000014,h) + 5) = (char)((uint)iVar1 >> 0x18);
  *(undefined8 *)(CONCAT44(in_register_00000014,h) + 6) = 0x3600000000;
  *(undefined1 *)(CONCAT44(in_register_00000014,h) + 0xe) = 0x28;
  *(undefined2 *)(CONCAT44(in_register_00000014,h) + 0xf) = 0;
  *(undefined1 *)(CONCAT44(in_register_00000014,h) + 0x11) = 0;
  *(char *)(CONCAT44(in_register_00000014,h) + 0x12) = (char)((ulong)filename & 0xffffffff);
  *(char *)(CONCAT44(in_register_00000014,h) + 0x13) = (char)(((ulong)filename & 0xffffffff) >> 8);
  *(char *)(CONCAT44(in_register_00000014,h) + 0x14) = (char)((ulong)filename >> 0x10);
  *(char *)(CONCAT44(in_register_00000014,h) + 0x15) = (char)((ulong)filename >> 0x18);
  *(char *)(CONCAT44(in_register_00000014,h) + 0x16) = (char)w;
  *(char *)(CONCAT44(in_register_00000014,h) + 0x17) = (char)(w >> 8);
  *(char *)(CONCAT44(in_register_00000014,h) + 0x18) = (char)(w >> 0x10);
  *(char *)(CONCAT44(in_register_00000014,h) + 0x19) = (char)(w >> 0x18);
  *(undefined2 *)(CONCAT44(in_register_00000014,h) + 0x1a) = 1;
  *(undefined1 *)(CONCAT44(in_register_00000014,h) + 0x1c) = 0x18;
  *(undefined8 *)(CONCAT44(in_register_00000014,h) + 0x26) = 0;
  *(undefined8 *)(CONCAT44(in_register_00000014,h) + 0x2e) = 0;
  *(undefined8 *)(CONCAT44(in_register_00000014,h) + 0x1d) = 0;
  *(undefined8 *)(CONCAT44(in_register_00000014,h) + 0x25) = 0;
  return w >> 0x10;
}

Assistant:

static int create_header(char* filename, uint32_t w, uint32_t h, uint8_t* data) {

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;

	unsigned char bmpfileheader[14] = {'B', 'M', 0, 0, 0, 0, 0, 0, 0, 0, 54, 0, 0, 0};
	unsigned char bmpinfoheader[40] = {40, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 24, 0};
	unsigned char bmppad[3] = {0, 0, 0};
	
	int index = 0;

	//Write file header
	bmpfileheader[ 2] = (unsigned char)(filesize);
	bmpfileheader[ 3] = (unsigned char)(filesize >> 8);
	bmpfileheader[ 4] = (unsigned char)(filesize >> 16);
	bmpfileheader[ 5] = (unsigned char)(filesize >> 24);

	memcpy(data + index, bmpfileheader, sizeof(bmpfileheader));
	index += sizeof(bmpfileheader);

	//Write info header
	bmpinfoheader[ 4] = (unsigned char)(w);
	bmpinfoheader[ 5] = (unsigned char)(w >> 8);
	bmpinfoheader[ 6] = (unsigned char)(w >> 16);
	bmpinfoheader[ 7] = (unsigned char)(w >> 24);
	bmpinfoheader[ 8] = (unsigned char)(h);
	bmpinfoheader[ 9] = (unsigned char)(h >> 8);
	bmpinfoheader[10] = (unsigned char)(h >> 16);
	bmpinfoheader[11] = (unsigned char)(h >> 24);

	memcpy(data + index, bmpinfoheader, sizeof(bmpinfoheader));
	index += sizeof(bmpinfoheader);

	return index;
}